

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
slang::function_ref<std::__cxx11::string()>::
callback_fn<slang::TimeTrace::beginTrace(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::__0>
          (intptr_t callable)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  anon_class_8_1_518e098f *in_stack_00000018;
  
  TimeTrace::
  beginTrace(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)
  ::$_0::operator()[abi_cxx11_(in_stack_00000018);
  return in_RDI;
}

Assistant:

static Ret callback_fn(intptr_t callable, Params... params) {
        return (*reinterpret_cast<Callable*>(callable))(std::forward<Params>(params)...);
    }